

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O0

void addtest(void *elem)

{
  bool bVar1;
  int iVar2;
  void *realret_00;
  void *retval;
  void *realret;
  int i;
  void *elem_local;
  
  realret_00 = add234(tree,elem);
  realret._4_4_ = 0;
  while( true ) {
    bVar1 = false;
    if (realret._4_4_ < arraylen) {
      iVar2 = (*cmp)(elem,array[realret._4_4_]);
      bVar1 = 0 < iVar2;
    }
    if (!bVar1) break;
    realret._4_4_ = realret._4_4_ + 1;
  }
  if ((realret._4_4_ < arraylen) && (iVar2 = (*cmp)(elem,array[realret._4_4_]), iVar2 == 0)) {
    if (realret_00 != array[realret._4_4_]) {
      error("add: retval was %p expected %p",realret_00,array[realret._4_4_]);
    }
  }
  else {
    internal_addtest(elem,realret._4_4_,realret_00);
  }
  return;
}

Assistant:

void addtest(void *elem)
{
    int i;
    void *realret;

    realret = add234(tree, elem);

    i = 0;
    while (i < arraylen && cmp(elem, array[i]) > 0)
        i++;
    if (i < arraylen && !cmp(elem, array[i])) {
        void *retval = array[i];       /* expect that returned not elem */
        if (realret != retval) {
            error("add: retval was %p expected %p", realret, retval);
        }
    } else
        internal_addtest(elem, i, realret);
}